

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgtclll(fitsfile *fptr,int colnum,int *typecode,LONGLONG *repeat,LONGLONG *width,int *status)

{
  int iVar1;
  long local_58;
  long tmpwidth;
  int decims;
  int hdutype;
  tcolumn *colptr;
  int *status_local;
  LONGLONG *width_local;
  LONGLONG *repeat_local;
  int *typecode_local;
  fitsfile *pfStack_18;
  int colnum_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    colptr = (tcolumn *)status;
    status_local = (int *)width;
    width_local = repeat;
    repeat_local = (LONGLONG *)typecode;
    typecode_local._4_4_ = colnum;
    pfStack_18 = fptr;
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1)) {
        return *(int *)colptr->ttype;
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if ((typecode_local._4_4_ < 1) || (pfStack_18->Fptr->tfield < typecode_local._4_4_)) {
      colptr->ttype[0] = '.';
      colptr->ttype[1] = '\x01';
      colptr->ttype[2] = '\0';
      colptr->ttype[3] = '\0';
      fptr_local._4_4_ = 0x12e;
    }
    else {
      _decims = pfStack_18->Fptr->tableptr + (typecode_local._4_4_ + -1);
      iVar1 = ffghdt(pfStack_18,(int *)((long)&tmpwidth + 4),(int *)colptr);
      if (iVar1 < 1) {
        if (tmpwidth._4_4_ == 1) {
          ffasfm(_decims->tform,(int *)repeat_local,&local_58,(int *)&tmpwidth,(int *)colptr);
          *(long *)status_local = local_58;
          if (width_local != (LONGLONG *)0x0) {
            *width_local = 1;
          }
        }
        else {
          if (repeat_local != (LONGLONG *)0x0) {
            *(int *)repeat_local = _decims->tdatatype;
          }
          if (status_local != (int *)0x0) {
            *(long *)status_local = _decims->twidth;
          }
          if (width_local != (LONGLONG *)0x0) {
            *width_local = _decims->trepeat;
          }
        }
        fptr_local._4_4_ = *(int *)colptr->ttype;
      }
      else {
        fptr_local._4_4_ = *(int *)colptr->ttype;
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgtclll( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,       /* I - column number                           */
            int *typecode,   /* O - datatype code (21 = short, etc)         */
            LONGLONG *repeat, /* O - repeat count of field                   */
            LONGLONG *width, /* O - if ASCII, width of field or unit string */
            int  *status)    /* IO - error status                           */
/*
  Get Type of table column. 
  Returns the datatype code of the column, as well as the vector
  repeat count and (if it is an ASCII character column) the
  width of the field or a unit string within the field.  This supports the
  TFORMn = 'rAw' syntax for specifying arrays of substrings, so
  if TFORMn = '60A12' then repeat = 60 and width = 12.
*/
{
    tcolumn *colptr;
    int hdutype, decims;
    long tmpwidth;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
        return(*status = BAD_COL_NUM);

    colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
    colptr += (colnum - 1);    /* offset to correct column */

    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == ASCII_TBL)
    {
       ffasfm(colptr->tform, typecode, &tmpwidth, &decims, status);
       *width = tmpwidth;
       
      if (repeat)
           *repeat = 1;
    }
    else
    {
      if (typecode)
          *typecode = colptr->tdatatype;

      if (width)
          *width = colptr->twidth;

      if (repeat)
          *repeat = colptr->trepeat;
    }

    return(*status);
}